

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash3.cpp
# Opt level: O2

void MurmurHash3_x86_128(void *key,int len,uint32_t seed,void *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  int *piVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  bool bVar11;
  
  lVar6 = (long)(len / 0x10);
  lVar5 = (long)(len / 0x10 << 4);
  piVar3 = (int *)((long)key + lVar5 + lVar6 * -0x10 + 0xc);
  uVar1 = seed;
  uVar2 = seed;
  uVar8 = seed;
  while (bVar11 = lVar6 != 0, lVar6 = lVar6 + -1, bVar11) {
    uVar8 = ((uint)(piVar3[-3] * 0x239b961b) >> 0x11 | piVar3[-3] * -0x34f28000) * -0x54f16877 ^
            uVar8;
    iVar9 = (uVar8 << 0x13 | uVar8 >> 0xd) + uVar2;
    uVar7 = ((uint)(piVar3[-2] * -0x54f16877) >> 0x10 | piVar3[-2] * -0x68770000) * 0x38b34ae5 ^
            uVar2;
    uVar8 = iVar9 * 5 + 0x561ccd1b;
    uVar2 = ((uVar7 << 0x11 | uVar7 >> 0xf) + uVar1) * 5 + 0xbcaa747;
    uVar10 = ((uint)(piVar3[-1] * 0x38b34ae5) >> 0xf | piVar3[-1] * -0x6a360000) * -0x5e1c746d ^
             uVar1;
    uVar7 = ((uint)(*piVar3 * -0x5e1c746d) >> 0xe | *piVar3 * 0x2e4c0000) * 0x239b961b ^ seed;
    uVar1 = ((uVar10 << 0xf | uVar10 >> 0x11) + seed) * 5 + 0x96cd1c35;
    seed = ((uVar7 << 0xd | uVar7 >> 0x13) + iVar9 * 5 + 0x561ccd1b) * 5 + 0x32ac3b17;
    piVar3 = piVar3 + 4;
  }
  uVar10 = 0;
  uVar7 = 0;
  switch(len & 0xf) {
  case 0xf:
    uVar7 = (uint)*(byte *)((long)key + lVar5 + 0xe) << 0x10;
  case 0xe:
    uVar7 = uVar7 | (uint)*(byte *)((long)key + lVar5 + 0xd) << 8;
  case 0xd:
    uVar7 = *(byte *)((long)key + lVar5 + 0xc) ^ uVar7;
    seed = seed ^ (uVar7 * -0x5e1c746d >> 0xe | uVar7 * 0x2e4c0000) * 0x239b961b;
  case 0xc:
    uVar7 = (uint)*(byte *)((long)key + lVar5 + 0xb) << 0x18;
  case 0xb:
    uVar7 = uVar7 | (uint)*(byte *)((long)key + lVar5 + 10) << 0x10;
  case 10:
    uVar7 = uVar7 ^ (uint)*(byte *)((long)key + lVar5 + 9) << 8;
  case 9:
    uVar7 = *(byte *)((long)key + lVar5 + 8) ^ uVar7;
    uVar1 = uVar1 ^ (uVar7 * 0x38b34ae5 >> 0xf | uVar7 * -0x6a360000) * -0x5e1c746d;
  case 8:
    uVar7 = (uint)*(byte *)((long)key + lVar5 + 7) << 0x18;
  case 7:
    uVar7 = uVar7 | (uint)*(byte *)((long)key + lVar5 + 6) << 0x10;
  case 6:
    uVar7 = uVar7 ^ (uint)*(byte *)((long)key + lVar5 + 5) << 8;
  case 5:
    uVar7 = *(byte *)((long)key + lVar5 + 4) ^ uVar7;
    uVar2 = uVar2 ^ (uVar7 * -0x54f16877 >> 0x10 | uVar7 * -0x68770000) * 0x38b34ae5;
  case 4:
    uVar7 = (uint)*(byte *)((long)key + lVar5 + 3) << 0x18;
  case 3:
    uVar10 = uVar7 | (uint)*(byte *)((long)key + lVar5 + 2) << 0x10;
  case 2:
    uVar10 = uVar10 ^ (uint)*(byte *)((long)key + lVar5 + 1) << 8;
  case 1:
    uVar10 = *(byte *)((long)key + lVar5) ^ uVar10;
    uVar8 = uVar8 ^ (uVar10 * 0x239b961b >> 0x11 | uVar10 * -0x34f28000) * -0x54f16877;
  case 0:
    uVar10 = (uVar8 ^ len) + (uVar2 ^ len) + (uVar1 ^ len) + (seed ^ len);
    uVar7 = (uVar2 ^ len) + uVar10;
    uVar8 = (uVar1 ^ len) + uVar10;
    uVar4 = (seed ^ len) + uVar10;
    uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
    uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
    uVar7 = (uVar7 >> 0x10 ^ uVar7) * -0x7a143595;
    uVar7 = (uVar7 >> 0xd ^ uVar7) * -0x3d4d51cb;
    uVar7 = uVar7 >> 0x10 ^ uVar7;
    uVar8 = (uVar8 >> 0x10 ^ uVar8) * -0x7a143595;
    uVar8 = (uVar8 >> 0xd ^ uVar8) * -0x3d4d51cb;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
    uVar4 = (uVar4 >> 0x10 ^ uVar4) * -0x7a143595;
    uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    uVar4 = uVar4 >> 0x10 ^ uVar4;
    iVar9 = (uVar10 >> 0x10 ^ uVar10) + uVar7 + uVar8 + uVar4;
    *(int *)out = iVar9;
    *(uint *)((long)out + 4) = uVar7 + iVar9;
    *(uint *)((long)out + 8) = uVar8 + iVar9;
    *(uint *)((long)out + 0xc) = uVar4 + iVar9;
    return;
  }
}

Assistant:

void MurmurHash3_x86_128 ( const void * key, const int len,
                           uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = len / 16;

  uint32_t h1 = seed;
  uint32_t h2 = seed;
  uint32_t h3 = seed;
  uint32_t h4 = seed;

  const uint32_t c1 = 0x239b961b; 
  const uint32_t c2 = 0xab0e9789;
  const uint32_t c3 = 0x38b34ae5; 
  const uint32_t c4 = 0xa1e38b93;

  //----------
  // body

  const uint32_t * blocks = (const uint32_t *)(data + nblocks*16);

  for(int i = -nblocks; i; i++)
  {
    uint32_t k1 = getblock32(blocks,i*4+0);
    uint32_t k2 = getblock32(blocks,i*4+1);
    uint32_t k3 = getblock32(blocks,i*4+2);
    uint32_t k4 = getblock32(blocks,i*4+3);

    k1 *= c1; k1  = ROTL32(k1,15); k1 *= c2; h1 ^= k1;

    h1 = ROTL32(h1,19); h1 += h2; h1 = h1*5+0x561ccd1b;

    k2 *= c2; k2  = ROTL32(k2,16); k2 *= c3; h2 ^= k2;

    h2 = ROTL32(h2,17); h2 += h3; h2 = h2*5+0x0bcaa747;

    k3 *= c3; k3  = ROTL32(k3,17); k3 *= c4; h3 ^= k3;

    h3 = ROTL32(h3,15); h3 += h4; h3 = h3*5+0x96cd1c35;

    k4 *= c4; k4  = ROTL32(k4,18); k4 *= c1; h4 ^= k4;

    h4 = ROTL32(h4,13); h4 += h1; h4 = h4*5+0x32ac3b17;
  }

  //----------
  // tail

  const uint8_t * tail = (const uint8_t*)(data + nblocks*16);

  uint32_t k1 = 0;
  uint32_t k2 = 0;
  uint32_t k3 = 0;
  uint32_t k4 = 0;

  switch(len & 15)
  {
  case 15: k4 ^= tail[14] << 16;
  case 14: k4 ^= tail[13] << 8;
  case 13: k4 ^= tail[12] << 0;
           k4 *= c4; k4  = ROTL32(k4,18); k4 *= c1; h4 ^= k4;

  case 12: k3 ^= tail[11] << 24;
  case 11: k3 ^= tail[10] << 16;
  case 10: k3 ^= tail[ 9] << 8;
  case  9: k3 ^= tail[ 8] << 0;
           k3 *= c3; k3  = ROTL32(k3,17); k3 *= c4; h3 ^= k3;

  case  8: k2 ^= tail[ 7] << 24;
  case  7: k2 ^= tail[ 6] << 16;
  case  6: k2 ^= tail[ 5] << 8;
  case  5: k2 ^= tail[ 4] << 0;
           k2 *= c2; k2  = ROTL32(k2,16); k2 *= c3; h2 ^= k2;

  case  4: k1 ^= tail[ 3] << 24;
  case  3: k1 ^= tail[ 2] << 16;
  case  2: k1 ^= tail[ 1] << 8;
  case  1: k1 ^= tail[ 0] << 0;
           k1 *= c1; k1  = ROTL32(k1,15); k1 *= c2; h1 ^= k1;
  };

  //----------
  // finalization

  h1 ^= len; h2 ^= len; h3 ^= len; h4 ^= len;

  h1 += h2; h1 += h3; h1 += h4;
  h2 += h1; h3 += h1; h4 += h1;

  h1 = fmix32(h1);
  h2 = fmix32(h2);
  h3 = fmix32(h3);
  h4 = fmix32(h4);

  h1 += h2; h1 += h3; h1 += h4;
  h2 += h1; h3 += h1; h4 += h1;

  ((uint32_t*)out)[0] = h1;
  ((uint32_t*)out)[1] = h2;
  ((uint32_t*)out)[2] = h3;
  ((uint32_t*)out)[3] = h4;
}